

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

int run_test_fs_poll_close_request_multi_stop_start(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *loop_00;
  uv_loop_t *unaff_RBX;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  uv_fs_poll_t uStack_798;
  uv_loop_t uStack_730;
  uv_loop_t *puStack_3e0;
  undefined1 auStack_3d8 [952];
  
  puVar3 = (uv_loop_t *)auStack_3d8;
  puStack_3e0 = (uv_loop_t *)0x14fcfe;
  remove("testfile");
  puStack_3e0 = (uv_loop_t *)0x14fd08;
  iVar1 = uv_loop_init((uv_loop_t *)(auStack_3d8 + 0x68));
  if (iVar1 == 0) {
    puStack_3e0 = (uv_loop_t *)0x14fd1d;
    iVar1 = uv_fs_poll_init((uv_loop_t *)(auStack_3d8 + 0x68),(uv_fs_poll_t *)auStack_3d8);
    if (iVar1 != 0) goto LAB_0014fe02;
    iVar1 = 10;
    do {
      puStack_3e0 = (uv_loop_t *)0x14fd43;
      iVar2 = uv_fs_poll_stop((uv_fs_poll_t *)auStack_3d8);
      if (iVar2 != 0) {
LAB_0014fdf3:
        puStack_3e0 = (uv_loop_t *)0x14fdf8;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_0014fdf8;
      }
      puStack_3e0 = (uv_loop_t *)0x14fd5e;
      iVar2 = uv_fs_poll_start((uv_fs_poll_t *)auStack_3d8,poll_cb_fail,"testfile",100);
      if (iVar2 != 0) {
        puStack_3e0 = (uv_loop_t *)0x14fdf3;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_0014fdf3;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    puStack_3e0 = (uv_loop_t *)0x14fd79;
    uv_close((uv_handle_t *)auStack_3d8,close_cb);
    puVar3 = (uv_loop_t *)(auStack_3d8 + 0x68);
    while (close_cb_called == 0) {
      puStack_3e0 = (uv_loop_t *)0x14fd95;
      uv_run(puVar3,UV_RUN_ONCE);
    }
    if (close_cb_called != 1) {
LAB_0014fdf8:
      puStack_3e0 = (uv_loop_t *)0x14fdfd;
      run_test_fs_poll_close_request_multi_stop_start_cold_7();
      unaff_RBX = puVar3;
      goto LAB_0014fdfd;
    }
    puStack_3e0 = (uv_loop_t *)0x14fda6;
    iVar1 = uv_loop_close((uv_loop_t *)(auStack_3d8 + 0x68));
    if (iVar1 != 0) goto LAB_0014fe07;
    puStack_3e0 = (uv_loop_t *)0x14fdaf;
    puVar3 = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x14fdc3;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_3e0 = (uv_loop_t *)0x14fdcd;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_3e0 = (uv_loop_t *)0x14fdd2;
    loop_00 = uv_default_loop();
    puStack_3e0 = (uv_loop_t *)0x14fdda;
    iVar1 = uv_loop_close(loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0014fdfd:
    puStack_3e0 = (uv_loop_t *)0x14fe02;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_0014fe02:
    puVar3 = unaff_RBX;
    puStack_3e0 = (uv_loop_t *)0x14fe07;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_0014fe07:
    puStack_3e0 = (uv_loop_t *)0x14fe0c;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  puStack_3e0 = (uv_loop_t *)run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  puStack_3e0 = puVar3;
  remove("testfile");
  iVar1 = uv_loop_init(&uStack_730);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(&uStack_730,&uStack_798);
    if (iVar1 != 0) goto LAB_0014ff1f;
    iVar1 = uv_fs_poll_start(&uStack_798,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_0014ff24;
    uv_run(&uStack_730,UV_RUN_ONCE);
    iVar1 = uv_fs_poll_stop(&uStack_798);
    if (iVar1 != 0) goto LAB_0014ff29;
    uv_run(&uStack_730,UV_RUN_ONCE);
    uv_close((uv_handle_t *)&uStack_798,close_cb);
    uv_run(&uStack_730,UV_RUN_ONCE);
    if (close_cb_called != 1) goto LAB_0014ff2e;
    iVar1 = uv_loop_close(&uStack_730);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014ff38;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_0014ff1f:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_0014ff24:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0014ff29:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
LAB_0014ff2e:
    run_test_fs_poll_close_request_stop_when_active_cold_5();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_6();
LAB_0014ff38:
  run_test_fs_poll_close_request_stop_when_active_cold_7();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_stop_start) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT(0 == uv_fs_poll_stop(&poll_handle));
    ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}